

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclHash.c
# Opt level: O0

void Tcl_InitHashTable(Tcl_HashTable *tablePtr,int keyType)

{
  int keyType_local;
  Tcl_HashTable *tablePtr_local;
  
  tablePtr->buckets = tablePtr->staticBuckets;
  tablePtr->staticBuckets[1] = (Tcl_HashEntry *)0x0;
  tablePtr->staticBuckets[0] = (Tcl_HashEntry *)0x0;
  tablePtr->staticBuckets[3] = (Tcl_HashEntry *)0x0;
  tablePtr->staticBuckets[2] = (Tcl_HashEntry *)0x0;
  tablePtr->numBuckets = 4;
  tablePtr->numEntries = 0;
  tablePtr->rebuildSize = 0xc;
  tablePtr->downShift = 0x1c;
  tablePtr->mask = 3;
  tablePtr->keyType = keyType;
  if (keyType == 0) {
    tablePtr->findProc = StringFind;
    tablePtr->createProc = StringCreate;
  }
  else if (keyType == 1) {
    tablePtr->findProc = OneWordFind;
    tablePtr->createProc = OneWordCreate;
  }
  else {
    tablePtr->findProc = ArrayFind;
    tablePtr->createProc = ArrayCreate;
  }
  return;
}

Assistant:

void
Tcl_InitHashTable(register Tcl_HashTable *tablePtr, int keyType)
{
    tablePtr->buckets = tablePtr->staticBuckets;
    tablePtr->staticBuckets[0] = tablePtr->staticBuckets[1] = 0;
    tablePtr->staticBuckets[2] = tablePtr->staticBuckets[3] = 0;
    tablePtr->numBuckets = TCL_SMALL_HASH_TABLE;
    tablePtr->numEntries = 0;
    tablePtr->rebuildSize = TCL_SMALL_HASH_TABLE * REBUILD_MULTIPLIER;
    tablePtr->downShift = 28;
    tablePtr->mask = 3;
    tablePtr->keyType = keyType;
    if (keyType == TCL_STRING_KEYS) {
	tablePtr->findProc = StringFind;
	tablePtr->createProc = StringCreate;
    } else if (keyType == TCL_ONE_WORD_KEYS) {
	tablePtr->findProc = OneWordFind;
	tablePtr->createProc = OneWordCreate;
    } else {
	tablePtr->findProc = ArrayFind;
	tablePtr->createProc = ArrayCreate;
    };
}